

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O0

void __thiscall chatra::ArgumentMatcher::ArgumentMatcher(ArgumentMatcher *this)

{
  ArgumentMatcher *this_local;
  
  std::vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>::vector(&this->args);
  std::vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>::vector(&this->subArgs);
  this->listCount = 0;
  this->listCountWithoutDefaults = 0;
  this->dictCountWithoutDefaults = 0;
  this->hasListVarArg = false;
  this->hasDictVarArg = false;
  std::
  unordered_map<chatra::StringId,_unsigned_long,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>_>
  ::unordered_map(&this->byName);
  this->dictCountWithoutDefaults = 0;
  this->listCountWithoutDefaults = 0;
  this->listCount = 0;
  this->hasDictVarArg = false;
  this->hasListVarArg = false;
  return;
}

Assistant:

ArgumentMatcher::ArgumentMatcher() noexcept {
	listCount = listCountWithoutDefaults = dictCountWithoutDefaults = 0;
	hasListVarArg = hasDictVarArg = false;
}